

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O1

void __thiscall ON_MD5::set_final_hash(ON_MD5 *this)

{
  ON__UINT32 i;
  uint uVar1;
  long lVar2;
  uchar bits [8];
  ON__UINT32 local_10 [2];
  
  lVar2 = 0;
  do {
    local_10[lVar2] = this->m_bit_count[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  uVar1 = this->m_bit_count[0] >> 3 & 0x3f;
  Internal_Accumulate(this,set_final_hash::padding,((uint)(0x37 < uVar1) << 6 | 0x38) - uVar1);
  Internal_Accumulate(this,(ON__UINT8 *)local_10,8);
  lVar2 = 0;
  do {
    *(ON__UINT32 *)((this->m_md5_hash).m_digest + lVar2 * 4) = this->m_state[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void ON_MD5::set_final_hash()
{
  // MD5 finalization. 
  // Ends an MD5 message-digest operation and writes the message digest.
  static unsigned char padding[64] = {
    0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
  };

  // Save number of bits
  unsigned char bits[8];
  MD5_encode(bits, m_bit_count, 8);
 
  // pad out to 56 mod 64.
  const ON__UINT32 index = (m_bit_count[0] / 8) % 64;
  const ON__UINT32 padLen = (index < 56) ? (56 - index) : (120 - index);
  Internal_Accumulate(padding, padLen);
 
  // Append length (before padding)
  Internal_Accumulate(bits, 8);
 
  // Store final state in digest
  MD5_encode(m_md5_hash.m_digest, m_state, 16);
}